

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O1

void Gia_ManReprToAigRepr2(Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  Vec_Ptr_t *pVVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Aig_Obj_t *pNode2;
  Aig_Obj_t *pNode1;
  long lVar7;
  long lVar8;
  
  if (pAig->pReprs != (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x1cf,"void Gia_ManReprToAigRepr2(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("pGia->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x1d0,"void Gia_ManReprToAigRepr2(Aig_Man_t *, Gia_Man_t *)");
  }
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  uVar4 = (ulong)(uint)pGia->nObjs;
  if (0 < pGia->nObjs) {
    lVar8 = 2;
    lVar7 = 0;
    do {
      pGVar1 = pGia->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar6 = (ulong)(uint)pGia->pReprs[lVar7] & 0xfffffff;
      if (uVar6 == 0xfffffff) {
        pGVar3 = (Gia_Obj_t *)0x0;
      }
      else {
        if ((int)uVar4 <= (int)uVar6) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar3 = pGVar1 + uVar6;
      }
      if (pGVar3 != (Gia_Obj_t *)0x0) {
        if ((int)pGVar3->Value < 0) {
LAB_00643c8c:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        pVVar2 = pAig->vObjs;
        if (pVVar2 == (Vec_Ptr_t *)0x0) {
          pNode1 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar5 = pGVar3->Value >> 1;
          if (pVVar2->nSize <= (int)uVar5) goto LAB_00643cab;
          pNode1 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
        }
        if ((int)*(uint *)(&pGVar1->field_0x0 + lVar8 * 4) < 0) goto LAB_00643c8c;
        if (pVVar2 == (Vec_Ptr_t *)0x0) {
          pNode2 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar5 = *(uint *)(&pGVar1->field_0x0 + lVar8 * 4) >> 1;
          if (pVVar2->nSize <= (int)uVar5) {
LAB_00643cab:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pNode2 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
        }
        Aig_ObjCreateRepr(pAig,pNode1,pNode2);
      }
      lVar7 = lVar7 + 1;
      uVar4 = (ulong)pGia->nObjs;
      lVar8 = lVar8 + 3;
    } while (lVar7 < (long)uVar4);
  }
  return;
}

Assistant:

void Gia_ManReprToAigRepr2( Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Gia_Obj_t * pGiaObj, * pGiaRepr;
    int i;
    assert( pAig->pReprs == NULL );
    assert( pGia->pReprs != NULL );
    // set the pointers to the nodes in AIG
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Gia_ManForEachObj( pGia, pGiaObj, i )
    {
        pGiaRepr = Gia_ObjReprObj( pGia, i );
        if ( pGiaRepr == NULL )
            continue;
        Aig_ObjCreateRepr( pAig, Aig_ManObj(pAig, Abc_Lit2Var(pGiaRepr->Value)), Aig_ManObj(pAig, Abc_Lit2Var(pGiaObj->Value)) );
    }
}